

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

void __thiscall test_argmax::initialize_tensors(test_argmax *this,ggml_context *ctx)

{
  long lVar1;
  long lVar2;
  reference pvVar3;
  float *pfVar4;
  undefined8 in_RSI;
  int i;
  vector<float,_std::allocator<float>_> data;
  int64_t r;
  ggml_tensor *t;
  default_random_engine rng;
  random_device rd;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffebb8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *in_stack_ffffffffffffebc0;
  vector<float,_std::allocator<float>_> *pvVar5;
  undefined4 in_stack_ffffffffffffebd0;
  float in_stack_ffffffffffffebd4;
  pointer __n;
  int local_13e0;
  undefined1 local_13d9 [25];
  long local_13c0;
  vector<float,_std::allocator<float>_> *local_13b8;
  undefined8 in_stack_ffffffffffffec70;
  undefined8 in_stack_ffffffffffffec78;
  undefined8 in_stack_ffffffffffffec80;
  undefined4 in_stack_ffffffffffffee38;
  undefined4 in_stack_ffffffffffffee3c;
  undefined8 in_stack_ffffffffffffee40;
  
  std::random_device::random_device((random_device *)&stack0xffffffffffffec68);
  std::random_device::operator()((random_device *)0x18d373);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(in_stack_ffffffffffffebc0,(result_type)in_stack_ffffffffffffebb8);
  local_13b8 = (vector<float,_std::allocator<float>_> *)ggml_get_first_tensor(in_RSI);
  while (local_13b8 != (vector<float,_std::allocator<float>_> *)0x0) {
    if (*(int *)&(local_13b8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start == 0) {
      for (local_13c0 = 0; lVar1 = local_13c0, lVar2 = ggml_nrows(local_13b8), lVar1 < lVar2;
          local_13c0 = local_13c0 + 1) {
        __n = (local_13b8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage;
        pvVar5 = (vector<float,_std::allocator<float>_> *)local_13d9;
        std::allocator<float>::allocator((allocator<float> *)0x18d431);
        std::vector<float,_std::allocator<float>_>::vector
                  (pvVar5,(size_type)__n,
                   (allocator_type *)CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
        std::allocator<float>::~allocator((allocator<float> *)0x18d451);
        for (local_13e0 = 0;
            (long)local_13e0 <
            (long)(local_13b8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage; local_13e0 = local_13e0 + 1) {
          in_stack_ffffffffffffebd4 = (float)local_13e0;
          pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)(local_13d9 + 1),
                              (long)local_13e0);
          *pvVar3 = in_stack_ffffffffffffebd4;
        }
        std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffebb8);
        std::vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffebb8);
        std::
        shuffle<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   in_stack_ffffffffffffec80,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   in_stack_ffffffffffffec78,
                   (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                   in_stack_ffffffffffffec70);
        pvVar5 = local_13b8;
        pfVar4 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x18d52d);
        ggml_backend_tensor_set
                  (pvVar5,pfVar4,
                   local_13c0 *
                   (long)local_13b8[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                   (long)(local_13b8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage << 2);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_ffffffffffffebd4,in_stack_ffffffffffffebd0));
      }
    }
    else {
      init_tensor_uniform((ggml_tensor *)in_stack_ffffffffffffee40,(float)in_stack_ffffffffffffee3c,
                          (float)in_stack_ffffffffffffee38);
    }
    in_stack_ffffffffffffebb8 =
         (vector<float,_std::allocator<float>_> *)ggml_get_next_tensor(in_RSI,local_13b8);
    local_13b8 = in_stack_ffffffffffffebb8;
  }
  std::random_device::~random_device((random_device *)0x18d5fd);
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        std::random_device rd;
        std::default_random_engine rng(rd());
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_F32) {
                // initialize with unique values to avoid ties
                for (int64_t r = 0; r < ggml_nrows(t); r++) {
                    std::vector<float> data(t->ne[0]);
                    for (int i = 0; i < t->ne[0]; i++) {
                        data[i] = i;
                    }
                    std::shuffle(data.begin(), data.end(), rng);
                    ggml_backend_tensor_set(t, data.data(), r * t->nb[1], t->ne[0] * sizeof(float));
                }
            } else {
                init_tensor_uniform(t);
            }
        }
    }